

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinyexr.cc
# Opt level: O1

int main(int argc,char **argv)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint extraout_EAX;
  char *pcVar5;
  ulong uVar6;
  ulong in_RCX;
  ulong *extraout_RDX;
  ulong uVar7;
  char **unaff_RBX;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  long *plVar11;
  undefined8 *in_R8;
  long lVar12;
  ulong *puVar13;
  bool bVar14;
  bool bVar15;
  char *err;
  int height;
  int width;
  float *image;
  char *apcStackY_a8 [2];
  char acStackY_98 [16];
  ulong uStackY_88;
  long lStackY_80;
  char **ppcStackY_78;
  char *local_38;
  int local_30;
  int local_2c;
  EXRVersion local_28;
  
  local_38 = (char *)0x0;
  if (argc < 2) {
    main_cold_2();
    uVar4 = extraout_EAX;
  }
  else {
    unaff_RBX = (char **)argv[1];
    argv = unaff_RBX;
    uVar4 = ParseEXRVersionFromFile(&local_28,(char *)unaff_RBX);
    if (uVar4 == 0) {
      uVar4 = LoadEXRWithLayer((float **)&local_28,&local_2c,&local_30,(char *)unaff_RBX,(char *)0x0
                               ,&local_38);
      if (uVar4 == 0) {
        uVar4 = SaveEXR((float *)local_28._0_8_,local_2c,local_30,4,1,"output.exr",&local_38);
        if (uVar4 != 0) {
          if (local_38 == (char *)0x0) {
            fprintf(_stderr,"Failed to save EXR image. code = %d\n",(ulong)uVar4);
          }
          else {
            fprintf(_stderr,"Save EXR err: %s(code %d)\n",local_38,(ulong)uVar4);
          }
        }
        free((void *)local_28._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Wrote output.exr.",0x11);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      else {
        if (local_38 == (char *)0x0) {
          fprintf(_stderr,"Load EXR err: code = %d\n",(ulong)uVar4);
        }
        else {
          fprintf(_stderr,"Load EXR err: %s(code %d)\n",local_38,(ulong)uVar4);
        }
        if (local_38 != (char *)0x0) {
          free(local_38);
        }
      }
      return uVar4;
    }
  }
  plVar11 = (long *)(ulong)uVar4;
  main_cold_1();
  if (plVar11[1] == *plVar11) {
    return 0;
  }
  puVar13 = (ulong *)((long)argv + in_RCX);
  uVar8 = 0;
  uStackY_88 = in_RCX;
  ppcStackY_78 = unaff_RBX;
  do {
    lVar12 = uVar8 * 3;
    bVar14 = *(long *)(*plVar11 + 8 + uVar8 * 0x18) != *(long *)(*plVar11 + uVar8 * 0x18);
    if (bVar14) {
      uVar6 = 0;
      lStackY_80 = lVar12;
      do {
        lVar2 = *(long *)(*plVar11 + lVar12 * 8);
        bVar15 = *(long *)(lVar2 + 8 + uVar6 * 0x18) != *(long *)(lVar2 + uVar6 * 0x18);
        if (bVar15) {
          uVar4 = 1;
          uVar7 = 0;
          do {
            puVar1 = (ulong *)*extraout_RDX + 1;
            if (puVar13 <= puVar1) {
              pcVar10 = "Insufficient data size in offset table.";
              pcVar5 = "Insufficient data size in offset table.";
LAB_0010e1d9:
              apcStackY_a8[0] = acStackY_98;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)apcStackY_a8,pcVar10,pcVar5 + 0x27);
              if (in_R8 != (undefined8 *)0x0) {
                pcVar5 = strdup(apcStackY_a8[0]);
                *in_R8 = pcVar5;
              }
              if (apcStackY_a8[0] != acStackY_98) {
                operator_delete(apcStackY_a8[0]);
              }
              in_RCX = uStackY_88;
              lVar12 = lStackY_80;
              if (bVar15) {
                if (bVar14) {
                  return -4;
                }
                goto LAB_0010e254;
              }
              break;
            }
            uVar9 = *(ulong *)*extraout_RDX;
            if (in_RCX <= uVar9) {
              pcVar10 = "Invalid offset value in DecodeEXRImage.";
              pcVar5 = "Invalid offset value in DecodeEXRImage.";
              goto LAB_0010e1d9;
            }
            *extraout_RDX = (ulong)puVar1;
            lVar3 = uVar6 * 0x18;
            *(ulong *)(*(long *)(*(long *)(*plVar11 + uVar8 * 0x18) + lVar3) + uVar7 * 8) = uVar9;
            uVar7 = (ulong)uVar4;
            lVar2 = *(long *)(*plVar11 + uVar8 * 0x18);
            uVar9 = *(long *)(lVar2 + 8 + lVar3) - *(long *)(lVar2 + lVar3) >> 3;
            uVar4 = uVar4 + 1;
            bVar15 = uVar7 < uVar9;
          } while (uVar7 < uVar9);
        }
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar7 = (*(long *)(*plVar11 + 8 + lVar12 * 8) - *(long *)(*plVar11 + lVar12 * 8) >> 3) *
                -0x5555555555555555;
        bVar15 = uVar7 - uVar6 != 0;
        bVar14 = uVar6 <= uVar7 && bVar15;
      } while (uVar6 <= uVar7 && bVar15);
    }
LAB_0010e254:
    uVar8 = (ulong)((int)uVar8 + 1);
    uVar6 = (plVar11[1] - *plVar11 >> 3) * -0x5555555555555555;
    if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int test_main(int argc, char** argv) {
  const char* outfilename = "output_test.exr";
  const char* err = NULL;

  if (argc < 2) {
    fprintf(stderr, "Needs input.exr.\n");
    exit(-1);
  }

  if (argc > 2) {
    outfilename = argv[2];
  }

  const char* input_filename = argv[1];

#ifdef SIMPLE_API_EXAMPLE
  (void)outfilename;
  int width, height;
  float* image;

  int ret = IsEXR(input_filename);
  if (ret != TINYEXR_SUCCESS) {
    fprintf(stderr, "File not found or given file is not a EXR format. code %d\n", ret);
    exit(-1);
  }

  ret = LoadEXR(&image, &width, &height, input_filename, &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      fprintf(stderr, "Load EXR err: %s(code %d)\n", err, ret);
    } else {
      fprintf(stderr, "Load EXR err: code = %d\n", ret);
    }
    FreeEXRErrorMessage(err);
    return ret;
  }

  // SaveAsPFM("output.pfm", width, height, image);
  ret = SaveEXR(image, width, height, 4 /* =RGBA*/,
                1 /* = save as fp16 format */, "output.exr", &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      fprintf(stderr, "Save EXR err: %s(code %d)\n", err, ret);
    } else {
      fprintf(stderr, "Failed to save EXR image. code = %d\n", ret);
    }
  }
  free(image);

  std::cout << "Wrote output.exr." << std::endl;
#else

  EXRVersion exr_version;

  int ret = ParseEXRVersionFromFile(&exr_version, input_filename);
  if (ret != 0) {
    fprintf(stderr, "Invalid EXR file: %s\n", input_filename);
    return -1;
  }

  printf(
      "version: tiled = %d, long_name = %d, non_image = %d, multipart = %d\n",
      exr_version.tiled, exr_version.long_name, exr_version.non_image,
      exr_version.multipart);

  if (exr_version.multipart) {
    EXRHeader** exr_headers;  // list of EXRHeader pointers.
    int num_exr_headers;

    ret = ParseEXRMultipartHeaderFromFile(&exr_headers, &num_exr_headers,
                                          &exr_version, argv[1], &err);
    if (ret != 0) {
      fprintf(stderr, "Parse EXR err: %s\n", err);
      return ret;
    }

    printf("num parts = %d\n", num_exr_headers);

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      const EXRHeader& exr_header = *(exr_headers[i]);

      printf("Part: %lu\n", static_cast<unsigned long>(i));

      printf("dataWindow = %d, %d, %d, %d\n", exr_header.data_window.min_x,
             exr_header.data_window.min_y, exr_header.data_window.max_x,
             exr_header.data_window.max_y);
      printf("displayWindow = %d, %d, %d, %d\n", exr_header.display_window.min_x,
             exr_header.display_window.min_y, exr_header.display_window.max_x,
             exr_header.display_window.max_y);
      printf("screenWindowCenter = %f, %f\n",
             static_cast<double>(exr_header.screen_window_center[0]),
             static_cast<double>(exr_header.screen_window_center[1]));
      printf("screenWindowWidth = %f\n",
             static_cast<double>(exr_header.screen_window_width));
      printf("pixelAspectRatio = %f\n",
             static_cast<double>(exr_header.pixel_aspect_ratio));
      printf("lineOrder = %d\n", exr_header.line_order);

      if (exr_header.num_custom_attributes > 0) {
        printf("# of custom attributes = %d\n",
               exr_header.num_custom_attributes);
        for (int a = 0; a < exr_header.num_custom_attributes; a++) {
          printf("  [%d] name = %s, type = %s, size = %d\n", a,
                 exr_header.custom_attributes[a].name,
                 exr_header.custom_attributes[a].type,
                 exr_header.custom_attributes[a].size);
          // if (strcmp(exr_header.custom_attributes[i].type, "float") == 0) {
          //  printf("    value = %f\n", *reinterpret_cast<float
          //  *>(exr_header.custom_attributes[i].value));
          //}
        }
      }
    }

    std::vector<EXRImage> images(static_cast<size_t>(num_exr_headers));
    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      InitEXRImage(&images[i]);
    }

    ret = LoadEXRMultipartImageFromFile(
        &images.at(0), const_cast<const EXRHeader**>(exr_headers),
        static_cast<unsigned int>(num_exr_headers), input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Load EXR err: %s\n", err);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("Loaded %d part images\n", num_exr_headers);
    printf(
        "There is no saving feature for multi-part images, thus just exit an "
        "application...\n");

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      FreeEXRImage(&images.at(i));
    }

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      FreeEXRHeader(exr_headers[i]);
      free(exr_headers[i]);
    }
    free(exr_headers);

  } else {  // single-part EXR

    EXRHeader exr_header;
    InitEXRHeader(&exr_header);

    ret =
        ParseEXRHeaderFromFile(&exr_header, &exr_version, input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Parse single-part EXR err: %s\n", err);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("dataWindow = %d, %d, %d, %d\n", exr_header.data_window.min_x,
           exr_header.data_window.min_y, exr_header.data_window.max_x,
           exr_header.data_window.max_y);
    printf("displayWindow = %d, %d, %d, %d\n", exr_header.display_window.min_x,
           exr_header.display_window.min_y, exr_header.display_window.max_x,
           exr_header.display_window.max_y);
    printf("screenWindowCenter = %f, %f\n",
           static_cast<double>(exr_header.screen_window_center[0]),
           static_cast<double>(exr_header.screen_window_center[1]));
    printf("screenWindowWidth = %f\n",
           static_cast<double>(exr_header.screen_window_width));
    printf("pixelAspectRatio = %f\n",
           static_cast<double>(exr_header.pixel_aspect_ratio));
    printf("lineOrder = %d\n", exr_header.line_order);

    if (exr_header.num_custom_attributes > 0) {
      printf("# of custom attributes = %d\n", exr_header.num_custom_attributes);
      for (int i = 0; i < exr_header.num_custom_attributes; i++) {
        printf("  [%d] name = %s, type = %s, size = %d\n", i,
               exr_header.custom_attributes[i].name,
               exr_header.custom_attributes[i].type,
               exr_header.custom_attributes[i].size);
        // if (strcmp(exr_header.custom_attributes[i].type, "float") == 0) {
        //  printf("    value = %f\n", *reinterpret_cast<float
        //  *>(exr_header.custom_attributes[i].value));
        //}
      }
    }

    // Read HALF channel as FLOAT.
    for (int i = 0; i < exr_header.num_channels; i++) {
      if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
        exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
      }
    }

    EXRImage exr_image;
    InitEXRImage(&exr_image);

    ret = LoadEXRImageFromFile(&exr_image, &exr_header, input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Load EXR err: %s\n", err);
      FreeEXRHeader(&exr_header);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("EXR: %d x %d\n", exr_image.width, exr_image.height);

    for (int i = 0; i < exr_header.num_channels; i++) {
      printf("pixelType[%d]: %s\n", i, GetPixelType(exr_header.pixel_types[i]));
      printf("chan[%d] = %s\n", i, exr_header.channels[i].name);
      printf("requestedPixelType[%d]: %s\n", i,
             GetPixelType(exr_header.requested_pixel_types[i]));
    }

#if 0  // example to write custom attribute
    int version_minor = 3;
    exr_header.num_custom_attributes = 1;
    exr_header.custom_attributes = reinterpret_cast<EXRAttribute *>(malloc(sizeof(EXRAttribute) * exr_header.custom_attributes));
    strcpy(exr_header.custom_attributes[0].name, "tinyexr_version_minor");
    exr_header.custom_attributes[0].name[strlen("tinyexr_version_minor")] = '\0';
    strcpy(exr_header.custom_attributes[0].type, "int");
    exr_header.custom_attributes[0].type[strlen("int")] = '\0';
    exr_header.custom_attributes[0].size = sizeof(int);
    exr_header.custom_attributes[0].value = (unsigned char*)malloc(sizeof(int));
    memcpy(exr_header.custom_attributes[0].value, &version_minor, sizeof(int));
#endif

    if (exr_header.tiled) {
      TiledImageToScanlineImage(&exr_image, &exr_header);
    }

    exr_header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;

#ifdef TEST_ZFP_COMPRESSION
    // Assume input image is FLOAT pixel type.
    for (int i = 0; i < exr_header.num_channels; i++) {
      exr_header.channels[i].pixel_type = TINYEXR_PIXELTYPE_FLOAT;
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }

    unsigned char zfp_compression_type = TINYEXR_ZFP_COMPRESSIONTYPE_RATE;
    double zfp_compression_rate = 4;
    exr_header.num_custom_attributes = 2;
    strcpy(exr_header.custom_attributes[0].name, "zfpCompressionType");
    exr_header.custom_attributes[0].name[strlen("zfpCompressionType")] = '\0';
    exr_header.custom_attributes[0].size = 1;
    exr_header.custom_attributes[0].value =
        (unsigned char*)malloc(sizeof(unsigned char));
    exr_header.custom_attributes[0].value[0] = zfp_compression_type;

    strcpy(exr_header.custom_attributes[1].name, "zfpCompressionRate");
    exr_header.custom_attributes[1].name[strlen("zfpCompressionRate")] = '\0';
    exr_header.custom_attributes[1].size = sizeof(double);
    exr_header.custom_attributes[1].value =
        (unsigned char*)malloc(sizeof(double));
    memcpy(exr_header.custom_attributes[1].value, &zfp_compression_rate,
           sizeof(double));
    exr_header.compression_type = TINYEXR_COMPRESSIONTYPE_ZFP;
#endif

    ret = SaveEXRImageToFile(&exr_image, &exr_header, outfilename, &err);
    if (ret != 0) {
      fprintf(stderr, "Save EXR err: %s\n", err);
      FreeEXRHeader(&exr_header);
      FreeEXRErrorMessage(err);
      return ret;
    }
    printf("Saved exr file. [ %s ] \n", outfilename);

    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
  }
#endif

  return ret;
}